

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatTest_FormattedSize_Test::TestBody(FormatTest_FormattedSize_Test *this)

{
  string_view format_str;
  bool bVar1;
  Message *in_stack_00000008;
  AssertHelper *in_stack_00000010;
  AssertionResult gtest_ar;
  char *in_stack_ffffffffffffff88;
  basic_string_view<char> *in_stack_ffffffffffffff90;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  char *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  Type in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  AssertionResult local_18;
  
  fmt::v5::basic_string_view<char>::basic_string_view
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  uVar2 = 0x2a;
  format_str.data_._4_4_ = in_stack_ffffffffffffffbc;
  format_str.data_._0_4_ = in_stack_ffffffffffffffb8;
  format_str.size_._0_4_ = in_stack_ffffffffffffffc0;
  format_str.size_._4_4_ = 0x2a;
  fmt::v5::formatted_size<int>(format_str,in_stack_ffffffffffffffb0);
  this_00 = &local_18;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             in_stack_ffffffffffffffa0,
             (uint *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
             (unsigned_long *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar2,in_stack_ffffffffffffffc0));
    testing::AssertionResult::failure_message((AssertionResult *)0x181d82);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc,
               (char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0
              );
    testing::internal::AssertHelper::operator=(in_stack_00000010,in_stack_00000008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0x181dce);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x181e0e);
  return;
}

Assistant:

TEST(FormatTest, FormattedSize) {
  EXPECT_EQ(2u, fmt::formatted_size("{}", 42));
}